

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

__visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::And,_mathiu::impl::And_*,_const_mathiu::impl::And_*>_&>
 __thiscall matchit::impl::IdBlock<mathiu::impl::And>::hasValue(IdBlock<mathiu::impl::And> *this)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::And,_mathiu::impl::And_*,_const_mathiu::impl::And_*>_&>
  _Var1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1179:45)>
  local_1;
  
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::And>::hasValue()const::_lambda(mathiu::impl::And_const&)_1_,matchit::impl::IdBlock<mathiu::impl::And>::hasValue()const::_lambda(mathiu::impl::And_const*)_1_,matchit::impl::IdBlock<mathiu::impl::And>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::And,mathiu::impl::And*,mathiu::impl::And_const*>const&>
                    (&local_1,&(this->super_IdBlockBase<mathiu::impl::And>).mVariant);
  return _Var1;
}

Assistant:

constexpr auto hasValue() const
            {
                return std::visit(overload([](Type const &)
                                            { return true; },
                                            [](Type const *)
                                            { return true; },
                                            // [](Type *)
                                            // { return true; },
                                            [](std::monostate const &)
                                            { return false; }),
                                    IdBlockBase<Type>::mVariant);
            }